

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

void __thiscall LinearScan::ProcessEHRegionBoundary(LinearScan *this,Instr *instr)

{
  RegNum RVar1;
  Lifetime *spilledRange;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  code *pcVar2;
  SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *buffer;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  Type *ppLVar6;
  Instr *insertionInstr;
  undefined1 local_50 [8];
  EditingIterator iter;
  
  iter.super_EditingIterator.last = (NodeBase *)instr;
  if (instr->m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xba1,"(instr->IsBranchInstr())","instr->IsBranchInstr()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  uVar4 = *(ushort *)&iter.super_EditingIterator.last[6].next - 0xe7;
  if ((uVar4 < 5) && ((0x13U >> (uVar4 & 0x1f) & 1) != 0)) {
    local_50 = (undefined1  [8])this->activeLiveranges;
    iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
    iter.super_EditingIterator.super_Iterator.list =
         (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)local_50;
    bVar3 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                      ((EditingIterator *)local_50);
    if (bVar3) {
      do {
        ppLVar6 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                            ((Iterator *)local_50);
        insertionInstr = (Instr *)iter.super_EditingIterator.last;
        if (*(short *)&iter.super_EditingIterator.last[6].next == 0xeb) {
          insertionInstr = (Instr *)iter.super_EditingIterator.last[3].next;
        }
        RVar1 = (*ppLVar6)->reg;
        BVUnitT<unsigned_long>::AssertRange((uint)RVar1);
        RVar1 = RVar1 & (RegXMM15|RegXMM14);
        (this->activeRegs).word =
             (this->activeRegs).word & (-2L << RVar1 | 0xfffffffffffffffeU >> 0x40 - RVar1);
        spilledRange = *ppLVar6;
        if ((spilledRange->field_0x9d & 0x20) == 0) {
          this->intRegUsedCount = this->intRegUsedCount - 1;
        }
        else {
          this->floatRegUsedCount = this->floatRegUsedCount - 1;
        }
        SpillLiveRange(this,spilledRange,insertionInstr);
        buffer = iter.super_EditingIterator.super_Iterator.list;
        this_00 = *(ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> **)
                   ((long)local_50 + 0x10);
        SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::UnlinkCurrentNode
                  ((EditingIterator *)local_50);
        Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                  (this_00,buffer,0x10);
        bVar3 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                          ((EditingIterator *)local_50);
      } while (bVar3);
    }
  }
  return;
}

Assistant:

void
LinearScan::ProcessEHRegionBoundary(IR::Instr * instr)
{
    Assert(instr->IsBranchInstr());

    if (instr->m_opcode != Js::OpCode::TryCatch && instr->m_opcode != Js::OpCode::TryFinally && instr->m_opcode != Js::OpCode::Leave)
    {
        return;
    }

    // Spill everything upon entry to the try region and upon a Leave.
    FOREACH_SLIST_ENTRY_EDITING(Lifetime *, lifetime, this->activeLiveranges, iter)
    {
        IR::Instr* insertionInstr = instr->m_opcode != Js::OpCode::Leave ? instr : instr->m_prev;
        this->activeRegs.Clear(lifetime->reg);
        if (lifetime->IsInt())
        {
            this->intRegUsedCount--;
        }
        else
        {
            this->floatRegUsedCount--;
        }
        this->SpillLiveRange(lifetime, insertionInstr);
        iter.RemoveCurrent();
    }
    NEXT_SLIST_ENTRY_EDITING;
}